

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

char16 * __thiscall
Js::FunctionProxy::GetDebugNumberSet(FunctionProxy *this,wchar (*bufferToWriteTo) [42])

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  LocalFunctionId LVar4;
  int iVar5;
  undefined4 *puVar6;
  
  uVar1 = ((((((this->m_utf8SourceInfo).ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr)->
          sourceContextId;
  LVar4 = GetLocalFunctionId(this);
  iVar5 = swprintf_s((char16_t_conflict *)bufferToWriteTo,0x2a,
                     (char16_t_conflict *)L" (#%d.%u), #%u",(ulong)uVar1,(ulong)LVar4,
                     (ulong)this->m_functionNumber);
  if (iVar5 < 9) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xa1,"(len > 8)","len > 8");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  return *bufferToWriteTo;
}

Assistant:

char16* FunctionProxy::GetDebugNumberSet(wchar(&bufferToWriteTo)[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE]) const
    {
        // (#%u.%u), #%u --> (source file Id . function Id) , function Number
        int len = swprintf_s(bufferToWriteTo, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u(" (#%d.%u), #%u"),
            (int)this->GetSourceContextId(), this->GetLocalFunctionId(), this->GetFunctionNumber());
        Assert(len > 8);
        return bufferToWriteTo;
    }